

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js.h
# Opt level: O2

void __thiscall wasm::ABI::wasm2js::ensureHelpers(wasm2js *this,Module *wasm,IString specific)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  Name name_06;
  Name name_07;
  Name name_08;
  Name name_09;
  Name name_10;
  Name name_11;
  Name name_12;
  Name name_13;
  Name name_14;
  Name name_15;
  Module *local_100;
  IString specific_local;
  Type local_e8;
  Type local_e0;
  Type local_d8;
  Type local_d0;
  Type local_c8;
  Type local_c0;
  Type local_b8;
  Type local_b0;
  Type local_a8;
  Type local_a0;
  Type local_98;
  Type local_90;
  Module *local_88;
  Module *wasm_local;
  Type funcref;
  undefined1 local_40 [8];
  anon_class_16_2_b3eb4c27 ensureImport;
  
  pcVar2 = _operator<<;
  sVar1 = SCRATCH_LOAD_I32;
  specific_local.str._M_len = specific.str._M_len;
  ensureImport.wasm = &local_100;
  local_40 = (undefined1  [8])&local_88;
  funcref.id = 2;
  local_100 = wasm;
  local_88 = (Module *)this;
  ::wasm::Type::Type((Type *)&specific_local.str._M_str,&funcref,1);
  name.super_IString.str._M_str = pcVar2;
  name.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name,(Type)specific_local.str._M_str,(Type)0x2);
  pcVar2 = SCRATCH_LOAD_F64;
  sVar1 = SCRATCH_STORE_I32;
  funcref.id = 2;
  ::wasm::Type::Type(&local_e8,&funcref,2);
  name_00.super_IString.str._M_str = pcVar2;
  name_00.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_00,local_e8,(Type)0x0);
  name_01.super_IString.str._M_str = __Unwind_Resume;
  name_01.super_IString.str._M_len = SCRATCH_LOAD_F32;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_01,(Type)0x0,(Type)0x4);
  pcVar2 = std::cout;
  sVar1 = SCRATCH_STORE_F32;
  funcref.id = 4;
  ::wasm::Type::Type(&local_e0,&funcref,1);
  name_02.super_IString.str._M_str = pcVar2;
  name_02.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_02,local_e0,(Type)0x0);
  name_03.super_IString.str._M_str = cashew::OBJECT;
  name_03.super_IString.str._M_len = (size_t)SCRATCH_LOAD_F64;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_03,(Type)0x0,(Type)0x5);
  pcVar2 = UINT16ARRAY;
  sVar1 = SCRATCH_STORE_F64;
  funcref.id = 5;
  ::wasm::Type::Type(&local_d8,&funcref,1);
  name_04.super_IString.str._M_str = pcVar2;
  name_04.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_04,local_d8,(Type)0x0);
  pcVar2 = _finalize;
  sVar1 = MEMORY_INIT;
  funcref.id = 2;
  ::wasm::Type::Type(&local_d0,&funcref,4);
  name_05.super_IString.str._M_str = pcVar2;
  name_05.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_05,local_d0,(Type)0x0);
  pcVar2 = _append;
  sVar1 = MEMORY_FILL;
  funcref.id = 2;
  ::wasm::Type::Type(&local_c8,&funcref,3);
  name_06.super_IString.str._M_str = pcVar2;
  name_06.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_06,local_c8,(Type)0x0);
  pcVar2 = cashew::SET;
  sVar1 = MEMORY_COPY;
  funcref.id = 2;
  ::wasm::Type::Type(&local_c0,&funcref,3);
  name_07.super_IString.str._M_str = pcVar2;
  name_07.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_07,local_c0,(Type)0x0);
  pcVar2 = _dump;
  sVar1 = DATA_DROP;
  funcref.id = 2;
  ::wasm::Type::Type(&local_b8,&funcref,1);
  name_08.super_IString.str._M_str = pcVar2;
  name_08.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_08,local_b8,(Type)0x0);
  pcVar2 = TABLE_FILL;
  sVar1 = ATOMIC_WAIT_I32;
  funcref.id = 2;
  ::wasm::Type::Type(&local_b0,&funcref,5);
  name_09.super_IString.str._M_str = pcVar2;
  name_09.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_09,local_b0,(Type)0x2);
  pcVar2 = _endl<char,std::char_traits<char>>;
  sVar1 = ATOMIC_RMW_I64;
  funcref.id = 2;
  ::wasm::Type::Type(&local_a8,&funcref,6);
  name_10.super_IString.str._M_str = pcVar2;
  name_10.super_IString.str._M_len = sVar1;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_10,local_a8,(Type)0x2);
  name_11.super_IString.str._M_str = __M_construct;
  name_11.super_IString.str._M_len = GET_STASHED_BITS;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_11,(Type)0x0,(Type)0x2);
  name_12.super_IString.str._M_str = __M_create;
  name_12.super_IString.str._M_len = TRAP;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)local_40,name_12,(Type)0x0,(Type)0x0);
  if (((local_88->features).features & 0x100) != 0) {
    Type::Type((Type *)&wasm_local,(HeapType)0x10,Nullable,Inexact);
    pcVar2 = _getStruct;
    sVar1 = TABLE_GROW;
    funcref.id = (uintptr_t)wasm_local;
    ::wasm::Type::Type(&local_a0,&funcref,2);
    name_13.super_IString.str._M_str = pcVar2;
    name_13.super_IString.str._M_len = sVar1;
    ensureHelpers::anon_class_16_2_b3eb4c27::operator()
              ((anon_class_16_2_b3eb4c27 *)local_40,name_13,local_a0,(Type)0x0);
    pcVar3 = cashew::CALL;
    pcVar2 = TABLE_FILL;
    funcref.id = 2;
    ::wasm::Type::Type(&local_98,&funcref,3);
    name_14.super_IString.str._M_str = pcVar3;
    name_14.super_IString.str._M_len = (size_t)pcVar2;
    ensureHelpers::anon_class_16_2_b3eb4c27::operator()
              ((anon_class_16_2_b3eb4c27 *)local_40,name_14,local_98,(Type)0x0);
    pcVar2 = cashew::MINUS;
    sVar1 = TABLE_COPY;
    funcref.id = 2;
    ::wasm::Type::Type(&local_90,&funcref,3);
    name_15.super_IString.str._M_str = pcVar2;
    name_15.super_IString.str._M_len = sVar1;
    ensureHelpers::anon_class_16_2_b3eb4c27::operator()
              ((anon_class_16_2_b3eb4c27 *)local_40,name_15,local_90,(Type)0x0);
  }
  return;
}

Assistant:

inline void ensureHelpers(Module* wasm, IString specific = IString()) {
  auto ensureImport = [&](Name name, Type params, Type results) {
    if (wasm->getFunctionOrNull(name)) {
      return;
    }
    if (specific.is() && name != specific) {
      return;
    }
    auto func = Builder::makeFunction(name, Signature(params, results), {});
    func->module = ENV;
    func->base = name;
    wasm->addFunction(std::move(func));
  };

  ensureImport(SCRATCH_LOAD_I32, {Type::i32}, Type::i32);
  ensureImport(SCRATCH_STORE_I32, {Type::i32, Type::i32}, Type::none);
  ensureImport(SCRATCH_LOAD_F32, {}, Type::f32);
  ensureImport(SCRATCH_STORE_F32, {Type::f32}, Type::none);
  ensureImport(SCRATCH_LOAD_F64, {}, Type::f64);
  ensureImport(SCRATCH_STORE_F64, {Type::f64}, Type::none);
  ensureImport(
    MEMORY_INIT, {Type::i32, Type::i32, Type::i32, Type::i32}, Type::none);
  ensureImport(MEMORY_FILL, {Type::i32, Type::i32, Type::i32}, Type::none);
  ensureImport(MEMORY_COPY, {Type::i32, Type::i32, Type::i32}, Type::none);
  ensureImport(DATA_DROP, {Type::i32}, Type::none);
  ensureImport(ATOMIC_WAIT_I32,
               {Type::i32, Type::i32, Type::i32, Type::i32, Type::i32},
               Type::i32);
  ensureImport(
    ATOMIC_RMW_I64,
    {Type::i32, Type::i32, Type::i32, Type::i32, Type::i32, Type::i32},
    Type::i32);
  ensureImport(GET_STASHED_BITS, {}, Type::i32);
  ensureImport(TRAP, {}, Type::none);

  if (wasm->features.hasReferenceTypes()) {
    auto funcref = Type(HeapType::func, Nullable);
    ensureImport(TABLE_GROW, {funcref, Type::i32}, Type::none);
    ensureImport(TABLE_FILL, {Type::i32, funcref, Type::i32}, Type::none);
    ensureImport(TABLE_COPY, {Type::i32, Type::i32, Type::i32}, Type::none);
  }
}